

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

boolean Can_rise_up(level *lev,int x,int y)

{
  boolean bVar1;
  xchar xVar2;
  bool local_22;
  bool local_21;
  int y_local;
  int x_local;
  level *lev_local;
  
  if (((lev->z).dnum == dungeon_topology.d_astral_level.dnum) ||
     ((lev->z).dnum == dungeon_topology.d_sokoban_dnum)) {
LAB_001bf8b0:
    lev_local._7_1_ = false;
  }
  else {
    bVar1 = on_level(&lev->z,&dungeon_topology.d_wiz1_level);
    if (bVar1 != '\0') {
      bVar1 = In_W_tower(lev,x,y);
      if (bVar1 != '\0') goto LAB_001bf8b0;
    }
    local_21 = true;
    if ((lev->z).dlevel < '\x02') {
      local_22 = false;
      if (dungeons[(lev->z).dnum].entry_lev == '\x01') {
        xVar2 = ledger_no(&lev->z);
        local_22 = false;
        if ((xVar2 != '\x01') && (local_22 = false, (lev->sstairs).sx != '\0')) {
          local_22 = (lev->sstairs).up != '\0';
        }
      }
      local_21 = local_22;
    }
    lev_local._7_1_ = local_21;
  }
  return lev_local._7_1_;
}

Assistant:

boolean Can_rise_up(const struct level *lev, int x, int y)
{
    /* can't rise up from inside the top of the Wizard's tower */
    /* KMH -- or in sokoban */
    if (In_endgame(&lev->z) || In_sokoban(&lev->z) ||
			(Is_wiz1_level(&lev->z) && In_W_tower(lev, x, y)))
	return FALSE;
    return (boolean)(lev->z.dlevel > 1 ||
		(dungeons[lev->z.dnum].entry_lev == 1 && ledger_no(&lev->z) != 1 &&
		 lev->sstairs.sx && lev->sstairs.up));
}